

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TextureSwizzle::FunctionalTest::prepareProgram
          (FunctionalTest *this,size_t format_idx,programInfo *program)

{
  size_t position;
  string fs;
  size_t local_a0;
  undefined1 local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  GLint local_68 [4];
  string local_58;
  string local_38;
  
  prepareValues_abi_cxx11_(&local_38,(FunctionalTest *)format_idx,format_idx);
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_98._16_8_ = 0;
  local_98._24_8_ = 0;
  local_98._0_8_ = (GLchar *)0x0;
  local_98._8_8_ = 0;
  SmokeTest::getVertexShader_abi_cxx11_(&local_58,&this->super_SmokeTest,(testCase *)local_98,false)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,
             "#version 330 core\n\nout PREFIXvec4 out_color;\n\nvoid main()\n{\n    out_color = PREFIXvec4(VALUES);\n}\n\n"
             ,(allocator<char> *)&local_a0);
  local_a0 = 0;
  Utils::replaceToken("PREFIX",&local_a0,
                      *(GLchar **)(*(long *)(&DAT_01e7a2d8 + format_idx * 0x78) + 8),
                      (string *)local_98);
  Utils::replaceToken("PREFIX",&local_a0,
                      *(GLchar **)(*(long *)(&DAT_01e7a2d8 + format_idx * 0x78) + 8),
                      (string *)local_98);
  Utils::replaceToken("VALUES",&local_a0,local_38._M_dataplus._M_p,(string *)local_98);
  Utils::programInfo::build(program,(GLchar *)local_98._0_8_,local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void FunctionalTest::prepareProgram(size_t format_idx, Utils::programInfo& program)
{
	static const glw::GLchar* fs_template = "#version 330 core\n"
											"\n"
											"out PREFIXvec4 out_color;\n"
											"\n"
											"void main()\n"
											"{\n"
											"    out_color = PREFIXvec4(VALUES);\n"
											"}\n"
											"\n";

	const _texture_format& format = texture_formats[format_idx];
	const std::string&	 values = prepareValues(format_idx);
	const std::string&	 vs	 = getVertexShader(testCase(), false); /* Get blank VS */

	std::string fs		 = fs_template;
	size_t		position = 0;

	Utils::replaceToken("PREFIX", position, format.m_sampler.m_sampler_prefix, fs);
	Utils::replaceToken("PREFIX", position, format.m_sampler.m_sampler_prefix, fs);
	Utils::replaceToken("VALUES", position, values.c_str(), fs);

	program.build(fs.c_str(), vs.c_str());
}